

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O1

int32_t __thiscall aeron::Counter::state(Counter *this)

{
  int counterId;
  ClientConductor *pCVar1;
  
  pCVar1 = this->m_clientConductor;
  counterId = (this->super_AtomicCounter).m_counterId;
  concurrent::CountersReader::validateCounterId(&pCVar1->m_countersReader,counterId);
  return *(int32_t *)
          ((pCVar1->m_countersReader).m_metadataBuffer.m_buffer + (long)counterId * 0x200);
}

Assistant:

std::int32_t Counter::state() const
{
    return m_clientConductor->countersReader().getCounterState(id());
}